

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t ucase_toFullLower_63
                  (UChar32 c,UCaseContextIterator *iter,void *context,UChar **pString,int32_t loc)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  UBool UVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ushort *puVar8;
  uint local_7c;
  int local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  uint local_54;
  uint local_50;
  int32_t delta;
  int32_t full;
  uint16_t excWord;
  uint16_t *pe2;
  uint16_t *pe;
  uint local_30;
  uint16_t props;
  UChar32 result;
  int32_t loc_local;
  UChar **pString_local;
  void *context_local;
  UCaseContextIterator *iter_local;
  UChar32 c_local;
  
  uVar5 = c >> 5;
  if ((uint)c < 0xd800) {
    local_64 = (uint)ucase_props_trieIndex[(int)uVar5] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar6 = 0;
      if (c < 0xdc00) {
        iVar6 = 0x140;
      }
      local_68 = (uint)ucase_props_trieIndex[(int)(iVar6 + uVar5)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_70 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar5 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_70 = 0x2f1c;
        }
        local_6c = local_70;
      }
      else {
        local_6c = 0xd30;
      }
      local_68 = local_6c;
    }
    local_64 = local_68;
  }
  uVar1 = ucase_props_trieIndex[local_64];
  local_30 = c;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 2) != 0) {
      local_30 = c + ((int)(short)uVar1 >> 7);
    }
  }
  else {
    lVar7 = (long)((int)(uint)uVar1 >> 4);
    puVar8 = ucase_props_exceptions + lVar7 + 1;
    uVar2 = ucase_props_exceptions[lVar7];
    if ((uVar2 & 0x4000) == 0) {
      if ((uVar2 & 0x80) != 0) {
        if ((uVar2 & 0x100) == 0) {
          pe2 = puVar8 + (int)(uint)""[(int)(uVar2 & 0x7f)];
          uVar3 = *pe2;
        }
        else {
          pe2 = puVar8 + (long)(int)((uint)""[(int)(uVar2 & 0x7f)] << 1) + 1;
          uVar3 = *pe2;
        }
        local_50 = (uint)uVar3;
        if ((uVar3 & 0xf) != 0) {
          *pString = (UChar *)(pe2 + 1);
          return local_50 & 0xf;
        }
      }
    }
    else {
      if ((loc == 3) &&
         (((((c == 0x49 || (c == 0x4a)) || (c == 0x12e)) &&
           (UVar4 = isFollowedByMoreAbove(iter,context), UVar4 != '\0')) ||
          (((c == 0xcc || (c == 0xcd)) || (c == 0x128)))))) {
        if (c == 0x49) {
          *pString = L"i̇";
          return 2;
        }
        if (c == 0x4a) {
          *pString = L"j̇";
          return 2;
        }
        if (c == 0xcc) {
          *pString = L"i̇̀";
          return 3;
        }
        if (c != 0xcd) {
          if (c == 0x128) {
            *pString = L"i̇̃";
            return 3;
          }
          if (c != 0x12e) {
            return 0;
          }
          *pString = L"į̇";
          return 2;
        }
        *pString = L"i̇́";
        return 3;
      }
      if ((loc == 2) && (c == 0x130)) {
        return 0x69;
      }
      if (((loc == 2) && (c == 0x307)) && (UVar4 = isPrecededBy_I(iter,context), UVar4 != '\0')) {
        *pString = (UChar *)0x0;
        return 0;
      }
      if (((loc == 2) && (c == 0x49)) && (UVar4 = isFollowedByDotAbove(iter,context), UVar4 == '\0')
         ) {
        return 0x131;
      }
      if (c == 0x130) {
        *pString = L"i̇";
        return 2;
      }
      if (((c == 0x3a3) && (UVar4 = isFollowedByCasedLetter(iter,context,'\x01'), UVar4 == '\0')) &&
         (UVar4 = isFollowedByCasedLetter(iter,context,-1), UVar4 != '\0')) {
        return 0x3c2;
      }
    }
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 2) != 0)) {
      if ((uVar2 & 0x100) == 0) {
        local_54 = (uint)puVar8[(int)(uint)""[(int)(uVar2 & 0xf)]];
      }
      else {
        local_54 = CONCAT22(puVar8[(int)((uint)""[(int)(uVar2 & 0xf)] << 1)],
                            (puVar8 + (int)((uint)""[(int)(uVar2 & 0xf)] << 1))[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_54 = -local_54;
      }
      local_78 = c + local_54;
      return local_78;
    }
    if ((uVar2 & 1) != 0) {
      if ((uVar2 & 0x100) == 0) {
        local_30 = (uint)*puVar8;
      }
      else {
        local_30 = CONCAT22(*puVar8,ucase_props_exceptions[lVar7 + 2]);
      }
    }
  }
  if (local_30 == c) {
    local_7c = local_30 ^ 0xffffffff;
  }
  else {
    local_7c = local_30;
  }
  return local_7c;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucase_toFullLower(UChar32 c,
                  UCaseContextIterator *iter, void *context,
                  const UChar **pString,
                  int32_t loc) {
    // The sign of the result has meaning, input must be non-negative so that it can be returned as is.
    U_ASSERT(c >= 0);
    UChar32 result=c;
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            result=c+UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props), *pe2;
        uint16_t excWord=*pe++;
        int32_t full;

        pe2=pe;

        if(excWord&UCASE_EXC_CONDITIONAL_SPECIAL) {
            /* use hardcoded conditions and mappings */

            /*
             * Test for conditional mappings first
             *   (otherwise the unconditional default mappings are always taken),
             * then test for characters that have unconditional mappings in SpecialCasing.txt,
             * then get the UnicodeData.txt mappings.
             */
            if( loc==UCASE_LOC_LITHUANIAN &&
                    /* base characters, find accents above */
                    (((c==0x49 || c==0x4a || c==0x12e) &&
                        isFollowedByMoreAbove(iter, context)) ||
                    /* precomposed with accent above, no need to find one */
                    (c==0xcc || c==0xcd || c==0x128))
            ) {
                /*
                    # Lithuanian

                    # Lithuanian retains the dot in a lowercase i when followed by accents.

                    # Introduce an explicit dot above when lowercasing capital I's and J's
                    # whenever there are more accents above.
                    # (of the accents used in Lithuanian: grave, acute, tilde above, and ogonek)

                    0049; 0069 0307; 0049; 0049; lt More_Above; # LATIN CAPITAL LETTER I
                    004A; 006A 0307; 004A; 004A; lt More_Above; # LATIN CAPITAL LETTER J
                    012E; 012F 0307; 012E; 012E; lt More_Above; # LATIN CAPITAL LETTER I WITH OGONEK
                    00CC; 0069 0307 0300; 00CC; 00CC; lt; # LATIN CAPITAL LETTER I WITH GRAVE
                    00CD; 0069 0307 0301; 00CD; 00CD; lt; # LATIN CAPITAL LETTER I WITH ACUTE
                    0128; 0069 0307 0303; 0128; 0128; lt; # LATIN CAPITAL LETTER I WITH TILDE
                 */
                switch(c) {
                case 0x49:  /* LATIN CAPITAL LETTER I */
                    *pString=iDot;
                    return 2;
                case 0x4a:  /* LATIN CAPITAL LETTER J */
                    *pString=jDot;
                    return 2;
                case 0x12e: /* LATIN CAPITAL LETTER I WITH OGONEK */
                    *pString=iOgonekDot;
                    return 2;
                case 0xcc:  /* LATIN CAPITAL LETTER I WITH GRAVE */
                    *pString=iDotGrave;
                    return 3;
                case 0xcd:  /* LATIN CAPITAL LETTER I WITH ACUTE */
                    *pString=iDotAcute;
                    return 3;
                case 0x128: /* LATIN CAPITAL LETTER I WITH TILDE */
                    *pString=iDotTilde;
                    return 3;
                default:
                    return 0; /* will not occur */
                }
            /* # Turkish and Azeri */
            } else if(loc==UCASE_LOC_TURKISH && c==0x130) {
                /*
                    # I and i-dotless; I-dot and i are case pairs in Turkish and Azeri
                    # The following rules handle those cases.

                    0130; 0069; 0130; 0130; tr # LATIN CAPITAL LETTER I WITH DOT ABOVE
                    0130; 0069; 0130; 0130; az # LATIN CAPITAL LETTER I WITH DOT ABOVE
                 */
                return 0x69;
            } else if(loc==UCASE_LOC_TURKISH && c==0x307 && isPrecededBy_I(iter, context)) {
                /*
                    # When lowercasing, remove dot_above in the sequence I + dot_above, which will turn into i.
                    # This matches the behavior of the canonically equivalent I-dot_above

                    0307; ; 0307; 0307; tr After_I; # COMBINING DOT ABOVE
                    0307; ; 0307; 0307; az After_I; # COMBINING DOT ABOVE
                 */
                *pString=nullptr;
                return 0; /* remove the dot (continue without output) */
            } else if(loc==UCASE_LOC_TURKISH && c==0x49 && !isFollowedByDotAbove(iter, context)) {
                /*
                    # When lowercasing, unless an I is before a dot_above, it turns into a dotless i.

                    0049; 0131; 0049; 0049; tr Not_Before_Dot; # LATIN CAPITAL LETTER I
                    0049; 0131; 0049; 0049; az Not_Before_Dot; # LATIN CAPITAL LETTER I
                 */
                return 0x131;
            } else if(c==0x130) {
                /*
                    # Preserve canonical equivalence for I with dot. Turkic is handled below.

                    0130; 0069 0307; 0130; 0130; # LATIN CAPITAL LETTER I WITH DOT ABOVE
                 */
                *pString=iDot;
                return 2;
            } else if(  c==0x3a3 &&
                        !isFollowedByCasedLetter(iter, context, 1) &&
                        isFollowedByCasedLetter(iter, context, -1) /* -1=preceded */
            ) {
                /* greek capital sigma maps depending on surrounding cased letters (see SpecialCasing.txt) */
                /*
                    # Special case for final form of sigma

                    03A3; 03C2; 03A3; 03A3; Final_Sigma; # GREEK CAPITAL LETTER SIGMA
                 */
                return 0x3c2; /* greek small final sigma */
            } else {
                /* no known conditional special case mapping, use a normal mapping */
            }
        } else if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, full);
            full&=UCASE_FULL_LOWER;
            if(full!=0) {
                /* set the output pointer to the lowercase mapping */
                *pString=reinterpret_cast<const UChar *>(pe+1);

                /* return the string length */
                return full;
            }
        }

        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe2, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_LOWER, pe2, result);
        }
    }

    return (result==c) ? ~result : result;
}